

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmtowav.c
# Opt level: O3

void puts_uint16_le(uint16_t i,FILE *f)

{
  putc((int)(char)i,(FILE *)f);
  putc((int)(char)(i >> 8),(FILE *)f);
  return;
}

Assistant:

void puts_uint16_le(uint16_t i, FILE* f) {
	char* c = (char*)(&i);

	if(XM_BIG_ENDIAN) {
		putc(c[1], f);
		putc(c[0], f);
	} else {
		putc(c[0], f);
		putc(c[1], f);
	}
}